

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug_p.h
# Opt level: O2

void QtDebugUtils::formatNonNullQFlags<Qt::KeyboardModifier>
               (QDebug *debug,char *prefix,QFlags<Qt::KeyboardModifier> *value)

{
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  QArrayDataPointer<char> QStack_58;
  undefined1 *local_40;
  QMetaEnum local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)prefix != 0) {
    QDebug::operator<<(debug,", ");
    local_38 = QMetaEnum::fromType<QFlags<Qt::KeyboardModifier>>();
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_40,debug);
    debug->stream[0x31] = (Stream)0x1;
    QMetaEnum::valueToKeys((ulonglong)&QStack_58);
    QDebug::operator<<(debug,(QByteArray *)&QStack_58);
    QArrayDataPointer<char>::~QArrayDataPointer(&QStack_58);
    QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void formatNonNullQFlags(QDebug &debug, const char *prefix, const QFlags<Enum> &value)
{
    if (value) {
        debug << prefix;
        formatQFlags(debug, value);
    }
}